

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSetPageSize(Btree *p,int pageSize,int nReserve,int iFix)

{
  BtShared *pBt;
  u32 uVar1;
  int iVar2;
  uint nReserve_00;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  pBt->nReserveWanted = (u8)nReserve;
  nReserve_00 = pBt->pageSize - pBt->usableSize;
  if ((int)nReserve_00 <= nReserve) {
    nReserve_00 = nReserve;
  }
  if ((pBt->btsFlags & 2) == 0) {
    if ((pageSize - 0x200U < 0xfe01) && ((pageSize + 0x1ffffU & pageSize) == 0)) {
      uVar1 = 0x400;
      if ((int)nReserve_00 < 0x21) {
        uVar1 = pageSize;
      }
      if (pageSize != 0x200) {
        uVar1 = pageSize;
      }
      pBt->pageSize = uVar1;
      freeTempSpace(pBt);
    }
    iVar2 = sqlite3PagerSetPagesize(pBt->pPager,&pBt->pageSize,nReserve_00);
    pBt->usableSize = pBt->pageSize - (nReserve_00 & 0xffff);
    if (iFix != 0) {
      *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
    }
  }
  else {
    iVar2 = 8;
  }
  sqlite3BtreeLeave(p);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPageSize(Btree *p, int pageSize, int nReserve, int iFix){
  int rc = SQLITE_OK;
  int x;
  BtShared *pBt = p->pBt;
  assert( nReserve>=0 && nReserve<=255 );
  sqlite3BtreeEnter(p);
  pBt->nReserveWanted = nReserve;
  x = pBt->pageSize - pBt->usableSize;
  if( nReserve<x ) nReserve = x;
  if( pBt->btsFlags & BTS_PAGESIZE_FIXED ){
    sqlite3BtreeLeave(p);
    return SQLITE_READONLY;
  }
  assert( nReserve>=0 && nReserve<=255 );
  if( pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE &&
        ((pageSize-1)&pageSize)==0 ){
    assert( (pageSize & 7)==0 );
    assert( !pBt->pCursor );
    if( nReserve>32 && pageSize==512 ) pageSize = 1024;
    pBt->pageSize = (u32)pageSize;
    freeTempSpace(pBt);
  }
  rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
  pBt->usableSize = pBt->pageSize - (u16)nReserve;
  if( iFix ) pBt->btsFlags |= BTS_PAGESIZE_FIXED;
  sqlite3BtreeLeave(p);
  return rc;
}